

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void cs::foreach_helper<std::__cxx11::string,char>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pcVar4;
  _Elt_pointer ppsVar5;
  pointer dat;
  _Elt_pointer ppsVar6;
  scope_guard scope;
  scope_guard sStack_b8;
  _Map_pointer local_b0;
  any local_a8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_a0;
  string *local_98;
  
  local_a0 = body;
  local_98 = iterator;
  pbVar3 = cs_impl::any::const_val<std::__cxx11::string>(obj);
  if (pbVar3->_M_string_length != 0) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    scope_guard::scope_guard(&sStack_b8,context);
    pbVar3 = cs_impl::any::const_val<std::__cxx11::string>(obj);
    dat = (pbVar3->_M_dataplus)._M_p;
    pcVar4 = dat + pbVar3->_M_string_length;
    for (; dat != pcVar4; dat = dat + 1) {
      process_context::poll_event((process_context *)current_process);
      peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      cs_impl::any::any<char>(&local_a8,dat);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(peVar1->super_runtime_type).storage,local_98,&local_a8);
      cs_impl::any::recycle(&local_a8);
      ppsVar5 = (local_a0->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      ppsVar6 = (local_a0->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      local_b0 = (local_a0->
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      ppsVar2 = (local_a0->
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (ppsVar5 != ppsVar2) {
        statement_base::run(*ppsVar5);
        peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1->return_fcall != false) goto LAB_00160a0e;
        if (peVar1->break_block == true) {
          peVar1->break_block = false;
          goto LAB_00160a0e;
        }
        if (peVar1->continue_block != false) {
          peVar1->continue_block = false;
          break;
        }
        ppsVar5 = ppsVar5 + 1;
        if (ppsVar5 == ppsVar6) {
          ppsVar5 = local_b0[1];
          local_b0 = local_b0 + 1;
          ppsVar6 = ppsVar5 + 0x40;
        }
      }
      scope_guard::clear(&sStack_b8);
    }
LAB_00160a0e:
    scope_guard::~scope_guard(&sStack_b8);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}